

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT___10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                *message,uint tag,Visitor *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_02;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_03;
  type_by_index_t<5UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_04;
  type_by_index_t<6UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_05;
  type_by_index_t<7UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_06;
  type_by_index_t<8UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_07;
  type_by_index_t<9UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_08;
  type_by_index_t<10UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_09;
  type_by_index_t<11UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_10;
  type_by_index_t<12UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_11;
  type_by_index_t<13UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_12;
  type_by_index_t<14UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_13;
  type_by_index_t<15UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_14;
  type_by_index_t<16UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_15;
  type_by_index_t<17UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_16;
  type_by_index_t<18UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_17;
  type_by_index_t<19UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_18;
  type_by_index_t<20UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_19;
  type_by_index_t<21UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_20;
  type_by_index_t<22UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_21;
  type_by_index_t<23UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_22;
  type_by_index_t<24UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_23;
  type_by_index_t<25UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_24;
  type_by_index_t<26UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_25;
  type_by_index_t<27UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_26;
  type_by_index_t<28UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_27;
  type_by_index_t<29UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<290U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *field_28;
  int dummy [31];
  int index;
  Visitor *visitor_local;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *message_local;
  
  dummy[0x1d] = -1;
  unique0x1000074e = visitor;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field,stack0xffffffffffffffd8,dummy + 0x1d);
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_00,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0] = 0;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_01,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[1] = 0;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_02,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[2] = 0;
  field_03 = meta::
             get<4ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_03,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[3] = 0;
  field_04 = meta::
             get<5ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_04,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[4] = 0;
  field_05 = meta::
             get<6ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_05,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[5] = 0;
  field_06 = meta::
             get<7ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_06,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[6] = 0;
  field_07 = meta::
             get<8ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<8ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_07,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[7] = 0;
  field_08 = meta::
             get<9ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<9ul,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_08,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[8] = 0;
  field_09 = meta::
             get<10ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<10ul,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_09,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[9] = 0;
  field_10 = meta::
             get<11ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<11ul,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_10,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[10] = 0;
  field_11 = meta::
             get<12ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<12ul,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_11,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0xb] = 0;
  field_12 = meta::
             get<13ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<13ul,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_12,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0xc] = 0;
  field_13 = meta::
             get<14ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<14ul,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_13,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0xd] = 0;
  field_14 = meta::
             get<15ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<15ul,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_14,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0xe] = 0;
  field_15 = meta::
             get<16ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<16ul,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_15,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0xf] = 0;
  field_16 = meta::
             get<17ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<17ul,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_16,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x10] = 0;
  field_17 = meta::
             get<18ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<18ul,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_17,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x11] = 0;
  field_18 = meta::
             get<19ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<19ul,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_18,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x12] = 0;
  field_19 = meta::
             get<20ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<20ul,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_19,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x13] = 0;
  field_20 = meta::
             get<21ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<21ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_20,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x14] = 0;
  field_21 = meta::
             get<22ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<22ul,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_21,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x15] = 0;
  field_22 = meta::
             get<23ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<23ul,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_22,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x16] = 0;
  field_23 = meta::
             get<24ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<24ul,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_23,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x17] = 0;
  field_24 = meta::
             get<25ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<25ul,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_24,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x18] = 0;
  field_25 = meta::
             get<26ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<26ul,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_25,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x19] = 0;
  field_26 = meta::
             get<27ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<27ul,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_26,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x1a] = 0;
  field_27 = meta::
             get<28ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<28ul,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_27,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x1b] = 0;
  field_28 = meta::
             get<29ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<290u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                       (message);
  doVisitSingleField<29ul,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>::Visitor>
            (tag,field_28,stack0xffffffffffffffd8,dummy + 0x1d);
  dummy[0x1c] = 0;
  if (dummy[0x1d] != -1) {
    std::bitset<30UL>::set
              ((bitset<30UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_false>
                .value.m_view.second,(long)dummy[0x1d],true);
  }
  return dummy[0x1d] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }